

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O2

void WavParserHelper::PrintDataType(WavDataType DataType)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (DataType - WavData8bit < 6) {
    pcVar2 = &DAT_00107014 + *(int *)(&DAT_00107014 + (ulong)(DataType - WavData8bit) * 4);
  }
  else {
    pcVar2 = "WavData : Invalid";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void WavParserHelper::PrintDataType(WavDataType DataType)
{
	switch (DataType)
	{
	case WavDataType::WavData8bit:
		std::cout << "WavData : uint 8bit" << std::endl;
		break;
	case WavDataType::WavData12bit:
		std::cout << "WavData : int 12bit" << std::endl;
		break;
	case WavDataType::WavData16bit:
		std::cout << "WavData : int 16bit" << std::endl;
		break;
	case WavDataType::WavData24bit:
		std::cout << "WavData : int 24bit" << std::endl;
		break;
	case WavDataType::WavData32bit:
		std::cout << "WavData : float 32bit" << std::endl;
		break;
	case WavDataType::WavData64bit:
		std::cout << "WavData : double 64bit" << std::endl;
		break;
	default:
		std::cout << "WavData : Invalid" << std::endl;
	}

	return;
}